

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtException.h
# Opt level: O0

void __thiscall ft::Exception::~Exception(Exception *this)

{
  Exception *this_local;
  
  ~Exception(this);
  operator_delete(this);
  return;
}

Assistant:

Exception(const std::string& s, const FT_Error e)
    {
        msg = s + ", error code: " + std::to_string(e);
    }